

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O0

EnvNAV2DHashEntry_t * __thiscall EnvironmentNAV2D::GetHashEntry(EnvironmentNAV2D *this,int X,int Y)

{
  int iVar1;
  size_type sVar2;
  reference ppEVar3;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int ind;
  int binid;
  int local_20;
  
  iVar1 = (**(code **)(*in_RDI + 0x188))(in_RDI,in_ESI,in_EDX);
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>::size
                      ((vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_> *)
                       (in_RDI[0x44] + (long)iVar1 * 0x18));
    if ((int)sVar2 <= local_20) {
      return (EnvNAV2DHashEntry_t *)0x0;
    }
    ppEVar3 = std::vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>::operator[]
                        ((vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_> *)
                         (in_RDI[0x44] + (long)iVar1 * 0x18),(long)local_20);
    if (((*ppEVar3)->X == in_ESI) &&
       (ppEVar3 = std::vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>::operator[]
                            ((vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_> *)
                             (in_RDI[0x44] + (long)iVar1 * 0x18),(long)local_20),
       (*ppEVar3)->Y == in_EDX)) break;
    local_20 = local_20 + 1;
  }
  ppEVar3 = std::vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_>::operator[]
                      ((vector<ENVHASHENTRY_*,_std::allocator<ENVHASHENTRY_*>_> *)
                       (in_RDI[0x44] + (long)iVar1 * 0x18),(long)local_20);
  return *ppEVar3;
}

Assistant:

EnvNAV2DHashEntry_t* EnvironmentNAV2D::GetHashEntry(int X, int Y)
{
#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    int binid = GETHASHBIN(X, Y);

#if DEBUG
    if ((int)EnvNAV2D.Coord2StateIDHashTable[binid].size() > 500) {
        SBPL_PRINTF("WARNING: Hash table has a bin %d (X=%d Y=%d) of size %u\n",
                    binid, X, Y, (unsigned)EnvNAV2D.Coord2StateIDHashTable[binid].size());

        PrintHashTableHist();
    }
#endif

    //iterate over the states in the bin and select the perfect match
    for (int ind = 0; ind < (int)EnvNAV2D.Coord2StateIDHashTable[binid].size(); ind++) {
        if (EnvNAV2D.Coord2StateIDHashTable[binid][ind]->X == X &&
            EnvNAV2D.Coord2StateIDHashTable[binid][ind]->Y == Y)
        {
#if TIME_DEBUG
            time_gethash += clock()-currenttime;
#endif
            return EnvNAV2D.Coord2StateIDHashTable[binid][ind];
        }
    }

#if TIME_DEBUG
    time_gethash += clock()-currenttime;
#endif

    return NULL;
}